

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O0

int main(int argc,char **argv)

{
  ALLEGRO_EVENT_QUEUE *pAVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 in_XMM1_Qa;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_JOYSTICK *in_stack_000000e0;
  
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_primitives_addon();
  al_init_font_addon();
  lVar3 = al_create_display(0x400,0x300);
  if (lVar3 == 0) {
    abort_example("al_create_display failed\n");
  }
  al_install_keyboard();
  uVar5 = al_map_rgb(0,0);
  black.b = (float)in_XMM1_Qa;
  black.a = SUB84(in_XMM1_Qa,4);
  black.r = (float)(int)uVar5;
  black.g = (float)(int)((ulong)uVar5 >> 0x20);
  uVar5 = al_map_rgb(0xe0,0xe0);
  grey.b = (float)in_XMM1_Qa;
  grey.a = SUB84(in_XMM1_Qa,4);
  grey.r = (float)(int)uVar5;
  grey.g = (float)(int)((ulong)uVar5 >> 0x20);
  white._0_8_ = al_map_rgb(0xff,0xff);
  white._8_8_ = in_XMM1_Qa;
  font = (ALLEGRO_FONT *)al_create_builtin_font();
  al_install_joystick();
  event_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  if (event_queue == (ALLEGRO_EVENT_QUEUE *)0x0) {
    abort_example("al_create_event_queue failed\n");
  }
  lVar4 = al_get_keyboard_event_source();
  pAVar1 = event_queue;
  if (lVar4 != 0) {
    uVar5 = al_get_keyboard_event_source();
    al_register_event_source(pAVar1,uVar5);
  }
  pAVar1 = event_queue;
  uVar5 = al_get_display_event_source(lVar3);
  al_register_event_source(pAVar1,uVar5);
  pAVar1 = event_queue;
  uVar5 = al_get_joystick_event_source();
  al_register_event_source(pAVar1,uVar5);
  al_get_joystick(0);
  setup_joystick_values(in_stack_000000e0);
  main_loop();
  al_destroy_font(font);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_primitives_addon();
   al_init_font_addon();

   display = al_create_display(1024, 768);
   if (!display) {
      abort_example("al_create_display failed\n");
   }

   al_install_keyboard();

   black = al_map_rgb(0, 0, 0);
   grey = al_map_rgb(0xe0, 0xe0, 0xe0);
   white = al_map_rgb(255, 255, 255);
   font = al_create_builtin_font();

   al_install_joystick();

   event_queue = al_create_event_queue();
   if (!event_queue) {
      abort_example("al_create_event_queue failed\n");
   }

   if (al_get_keyboard_event_source()) {
      al_register_event_source(event_queue, al_get_keyboard_event_source());
   }
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_joystick_event_source());

   setup_joystick_values(al_get_joystick(0));

   main_loop();

   al_destroy_font(font);

   return 0;
}